

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

PPointer * NewPointer(PType *type)

{
  size_t in_RAX;
  PPointer *this;
  size_t bucket;
  size_t local_18;
  
  local_18 = in_RAX;
  this = (PPointer *)
         FTypeTable::FindType
                   (&TypeTable,PPointer::RegistrationInfo.MyClass,(intptr_t)type,0,&local_18);
  if (this == (PPointer *)0x0) {
    this = (PPointer *)DObject::operator_new(0x88);
    PPointer::PPointer(this,type);
    FTypeTable::AddType(&TypeTable,(PType *)this,PPointer::RegistrationInfo.MyClass,(intptr_t)type,0
                        ,local_18);
  }
  return this;
}

Assistant:

PPointer *NewPointer(PType *type)
{
	size_t bucket;
	PType *ptype = TypeTable.FindType(RUNTIME_CLASS(PPointer), (intptr_t)type, 0, &bucket);
	if (ptype == NULL)
	{
		ptype = new PPointer(type);
		TypeTable.AddType(ptype, RUNTIME_CLASS(PPointer), (intptr_t)type, 0, bucket);
	}
	return static_cast<PPointer *>(ptype);
}